

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall
cmGeneratorTarget::ComputePDBOutputDir
          (cmGeneratorTarget *this,string *kind,string *config,string *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char *pcVar3;
  size_type sVar4;
  cmGlobalGenerator *pcVar5;
  char *pcVar6;
  long *plVar7;
  long *plVar8;
  string configPropStr;
  string conf;
  string propertyNameStr;
  string configUpper;
  string local_f0;
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  string local_b0;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  long *local_70;
  long local_68;
  long local_60 [2];
  string local_50;
  
  pcVar2 = (kind->_M_dataplus)._M_p;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + kind->_M_string_length);
  if (local_68 == 0) {
    plVar8 = (long *)0x0;
  }
  else {
    std::__cxx11::string::append((char *)&local_70);
    plVar8 = local_70;
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  pcVar2 = (config->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar2,pcVar2 + config->_M_string_length);
  cmsys::SystemTools::UpperCase(&local_50,&local_b0);
  local_d0 = local_c0;
  pcVar2 = (kind->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar2,pcVar2 + kind->_M_string_length);
  if (local_c8 == 0) {
    plVar7 = (long *)0x0;
  }
  else {
    std::__cxx11::string::append((char *)&local_d0);
    std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_50._M_dataplus._M_p);
    plVar7 = local_d0;
  }
  std::__cxx11::string::string((string *)&local_f0,(char *)plVar7,(allocator *)&local_90);
  pcVar6 = GetProperty(this,&local_f0);
  paVar1 = &local_f0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,
                    CONCAT62(local_f0.field_2._M_allocated_capacity._2_6_,
                             local_f0.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if (pcVar6 == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_f0,(char *)plVar8,(allocator *)&local_90);
    pcVar6 = GetProperty(this,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,
                      CONCAT62(local_f0.field_2._M_allocated_capacity._2_6_,
                               local_f0.field_2._M_allocated_capacity._0_2_) + 1);
    }
    if (pcVar6 != (char *)0x0) {
      pcVar3 = (char *)out->_M_string_length;
      strlen(pcVar6);
      std::__cxx11::string::_M_replace((ulong)out,0,pcVar3,(ulong)pcVar6);
    }
  }
  else {
    pcVar3 = (char *)out->_M_string_length;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)out,0,pcVar3,(ulong)pcVar6);
    std::__cxx11::string::_M_replace((ulong)&local_b0,0,(char *)local_b0._M_string_length,0x5ebb3a);
  }
  sVar4 = out->_M_string_length;
  if (sVar4 != 0) {
    pcVar6 = cmLocalGenerator::GetCurrentBinaryDirectory(this->LocalGenerator);
    cmsys::SystemTools::CollapseFullPath(&local_f0,out,pcVar6);
    std::__cxx11::string::operator=((string *)out,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,
                      CONCAT62(local_f0.field_2._M_allocated_capacity._2_6_,
                               local_f0.field_2._M_allocated_capacity._0_2_) + 1);
    }
    if ((char *)local_b0._M_string_length != (char *)0x0) {
      pcVar5 = this->LocalGenerator->GlobalGenerator;
      local_f0.field_2._M_allocated_capacity._0_2_ = 0x2f;
      local_f0._M_string_length = 1;
      local_88 = 0;
      local_80 = 0;
      local_f0._M_dataplus._M_p = (pointer)paVar1;
      local_90 = &local_80;
      (*pcVar5->_vptr_cmGlobalGenerator[0x12])(pcVar5,&local_f0,&local_b0,&local_90,out);
      if (local_90 != &local_80) {
        operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_f0._M_dataplus._M_p,
                        CONCAT62(local_f0.field_2._M_allocated_capacity._2_6_,
                                 local_f0.field_2._M_allocated_capacity._0_2_) + 1);
      }
    }
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return sVar4 != 0;
}

Assistant:

bool cmGeneratorTarget::ComputePDBOutputDir(const std::string& kind,
                                            const std::string& config,
                                            std::string& out) const
{
  // Look for a target property defining the target output directory
  // based on the target type.
  const char* propertyName = CM_NULLPTR;
  std::string propertyNameStr = kind;
  if (!propertyNameStr.empty()) {
    propertyNameStr += "_OUTPUT_DIRECTORY";
    propertyName = propertyNameStr.c_str();
  }
  std::string conf = config;

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(conf);
  const char* configProp = CM_NULLPTR;
  std::string configPropStr = kind;
  if (!configPropStr.empty()) {
    configPropStr += "_OUTPUT_DIRECTORY_";
    configPropStr += configUpper;
    configProp = configPropStr.c_str();
  }

  // Select an output directory.
  if (const char* config_outdir = this->GetProperty(configProp)) {
    // Use the user-specified per-configuration output directory.
    out = config_outdir;

    // Skip per-configuration subdirectory.
    conf = "";
  } else if (const char* outdir = this->GetProperty(propertyName)) {
    // Use the user-specified output directory.
    out = outdir;
  }
  if (out.empty()) {
    return false;
  }

  // Convert the output path to a full path in case it is
  // specified as a relative path.  Treat a relative path as
  // relative to the current output directory for this makefile.
  out = (cmSystemTools::CollapseFullPath(
    out, this->LocalGenerator->GetCurrentBinaryDirectory()));

  // The generator may add the configuration's subdirectory.
  if (!conf.empty()) {
    this->LocalGenerator->GetGlobalGenerator()->AppendDirectoryForConfig(
      "/", conf, "", out);
  }
  return true;
}